

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O3

int __thiscall OpenMD::SelectionCompiler::getHexitValue(SelectionCompiler *this,char ch)

{
  int iVar1;
  undefined3 in_register_00000031;
  int iVar2;
  
  iVar2 = CONCAT31(in_register_00000031,ch);
  if ((byte)(ch - 0x30U) < 10) {
    return iVar2 + -0x30;
  }
  if ((byte)(ch + 0x9fU) < 6) {
    return iVar2 + -0x57;
  }
  iVar1 = -1;
  if ((byte)(ch + 0xbfU) < 6) {
    iVar1 = iVar2 + -0x37;
  }
  return iVar1;
}

Assistant:

int SelectionCompiler::getHexitValue(char ch) {
    if (ch >= '0' && ch <= '9')
      return ch - '0';
    else if (ch >= 'a' && ch <= 'f')
      return 10 + ch - 'a';
    else if (ch >= 'A' && ch <= 'F')
      return 10 + ch - 'A';
    else
      return -1;
  }